

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::BuildReservedRange
          (DescriptorBuilder *this,ReservedRange *proto,Descriptor *parent,ReservedRange *result,
          FlatAllocator *param_4)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  string_view element_name;
  string_view element_name_00;
  Descriptor *local_40;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>::iterator,_bool>
  local_38;
  
  iVar2 = (proto->field_0)._impl_.start_;
  result->start = iVar2;
  iVar3 = (proto->field_0)._impl_.end_;
  result->end = iVar3;
  local_40 = parent;
  if (iVar2 < 1) {
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
    ::try_emplace_impl<google::protobuf::Descriptor_const*const&>
              (&local_38,&this->message_hints_,&local_40);
    iVar2 = result->start;
    iVar3 = result->end;
    if (result->end < 1) {
      iVar3 = 0;
    }
    if (0x1ffffffe < iVar3) {
      iVar3 = 0x1fffffff;
    }
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    if (0x1ffffffe < iVar2) {
      iVar2 = 0x1fffffff;
    }
    iVar3 = iVar3 - iVar2;
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    iVar3 = iVar3 + *(int *)((long)local_38.first.field_1.slot_ + 8);
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    if (0x1ffffffe < iVar3) {
      iVar3 = 0x1fffffff;
    }
    *(int *)((long)local_38.first.field_1.slot_ + 8) = iVar3;
    if (*(long *)((long)local_38.first.field_1.slot_ + 0x10) == 0) {
      *(ReservedRange **)((long)local_38.first.field_1.slot_ + 0x10) = proto;
      *(undefined4 *)((long)local_38.first.field_1.slot_ + 0x18) = 1;
    }
    pcVar1 = (local_40->all_names_).payload_;
    element_name._M_len = (ulong)*(ushort *)(pcVar1 + 2);
    element_name._M_str = pcVar1 + ~element_name._M_len;
    AddError(this,element_name,&proto->super_Message,NUMBER,
             "Reserved numbers must be positive integers.");
    iVar2 = result->start;
    iVar3 = result->end;
  }
  if (iVar3 <= iVar2) {
    pcVar1 = (local_40->all_names_).payload_;
    element_name_00._M_len = (ulong)*(ushort *)(pcVar1 + 2);
    element_name_00._M_str = pcVar1 + ~element_name_00._M_len;
    AddError(this,element_name_00,&proto->super_Message,NUMBER,
             "Reserved range end number must be greater than start number.");
  }
  return;
}

Assistant:

void DescriptorBuilder::BuildReservedRange(
    const DescriptorProto::ReservedRange& proto, const Descriptor* parent,
    Descriptor::ReservedRange* result, internal::FlatAllocator&) {
  result->start = proto.start();
  result->end = proto.end();
  if (result->start <= 0) {
    message_hints_[parent].RequestHintOnFieldNumbers(
        proto, DescriptorPool::ErrorCollector::NUMBER, result->start,
        result->end);
    AddError(parent->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             "Reserved numbers must be positive integers.");
  }
  if (result->start >= result->end) {
    AddError(parent->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             "Reserved range end number must be greater than start number.");
  }
}